

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldName
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,
          TextGenerator *generator)

{
  FieldDescriptor *pFVar1;
  undefined8 *puVar2;
  int size;
  char *text;
  
  if (field[0x34] == (FieldDescriptor)0x1) {
    TextGenerator::Print(generator,"[",1);
    if ((((*(char *)(*(long *)(*(long *)(field + 0x38) + 0x20) + 0x58) != '\x01') ||
         (*(int *)(field + 0x2c) != 0xb)) || (*(int *)(field + 0x30) != 1)) ||
       (pFVar1 = *(FieldDescriptor **)(field + 0x48),
       *(FieldDescriptor **)(field + 0x40) != *(FieldDescriptor **)(field + 0x48))) {
      pFVar1 = field;
    }
    TextGenerator::Print
              (generator,(char *)**(undefined8 **)(pFVar1 + 8),
               *(int *)(*(undefined8 **)(pFVar1 + 8) + 1));
    text = "]";
    size = 1;
  }
  else {
    if (*(int *)(field + 0x2c) == 10) {
      puVar2 = (undefined8 *)**(undefined8 **)(field + 0x48);
    }
    else {
      puVar2 = *(undefined8 **)field;
    }
    text = (char *)*puVar2;
    size = *(int *)(puVar2 + 1);
  }
  TextGenerator::Print(generator,text,size);
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldName(const Message& message,
                                         const Reflection* reflection,
                                         const FieldDescriptor* field,
                                         TextGenerator& generator) const {
  if (field->is_extension()) {
    generator.Print("[");
    // We special-case MessageSet elements for compatibility with proto1.
    if (field->containing_type()->options().message_set_wire_format()
        && field->type() == FieldDescriptor::TYPE_MESSAGE
        && field->is_optional()
        && field->extension_scope() == field->message_type()) {
      generator.Print(field->message_type()->full_name());
    } else {
      generator.Print(field->full_name());
    }
    generator.Print("]");
  } else {
    if (field->type() == FieldDescriptor::TYPE_GROUP) {
      // Groups must be serialized with their original capitalization.
      generator.Print(field->message_type()->name());
    } else {
      generator.Print(field->name());
    }
  }
}